

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O2

string * __thiscall
ApprovalTests::ApprovalTestNamer::getDirectory_abi_cxx11_
          (string *__return_storage_ptr__,ApprovalTestNamer *this)

{
  string sub_directory;
  string local_30;
  
  getTestSourceDirectory_abi_cxx11_(__return_storage_ptr__,this);
  getApprovalsSubdirectory_abi_cxx11_(&local_30,this);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  SystemUtils::ensureDirectoryExists(__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string ApprovalTestNamer::getDirectory() const
    {
        std::string directory = getTestSourceDirectory();
        std::string sub_directory = getApprovalsSubdirectory();
        directory += sub_directory;
        SystemUtils::ensureDirectoryExists(directory);
        return directory;
    }